

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void writeJSONStreamFile(int version,Writer *jw,Stream *stream,int id,
                        qpdf_stream_decode_level_e decode_level,string *file_prefix)

{
  char *filename_00;
  undefined1 local_e0 [8];
  Pl_StdioFile f_pl;
  FILE *f;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string *file_prefix_local;
  qpdf_stream_decode_level_e decode_level_local;
  int id_local;
  Stream *stream_local;
  Writer *jw_local;
  int version_local;
  
  filename.field_2._8_8_ = file_prefix;
  std::operator+(&local_70,file_prefix,"-");
  std::__cxx11::to_string(&local_90,id);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 &local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  filename_00 = (char *)std::__cxx11::string::c_str();
  f_pl.m._M_t.
  super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>._M_t.
  super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>.
  super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl =
       (__uniq_ptr_data<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>,_true,_true>
        )QUtil::safe_fopen(filename_00,"wb");
  Pl_StdioFile::Pl_StdioFile
            ((Pl_StdioFile *)local_e0,"stream data",
             (FILE *)f_pl.m._M_t.
                     super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>
                     .super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl);
  qpdf::Stream::writeStreamJSON
            (stream,version,jw,qpdf_sj_file,decode_level,(Pipeline *)local_e0,(string *)local_50,
             false);
  Pl_StdioFile::finish((Pl_StdioFile *)local_e0);
  fclose((FILE *)f_pl.m._M_t.
                 super___uniq_ptr_impl<Pl_StdioFile::Members,_std::default_delete<Pl_StdioFile::Members>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Pl_StdioFile::Members_*,_std::default_delete<Pl_StdioFile::Members>_>
                 .super__Head_base<0UL,_Pl_StdioFile::Members_*,_false>._M_head_impl);
  Pl_StdioFile::~Pl_StdioFile((Pl_StdioFile *)local_e0);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void
writeJSONStreamFile(
    int version,
    JSON::Writer& jw,
    qpdf::Stream& stream,
    int id,
    qpdf_stream_decode_level_e decode_level,
    std::string const& file_prefix)
{
    auto filename = file_prefix + "-" + std::to_string(id);
    auto* f = QUtil::safe_fopen(filename.c_str(), "wb");
    Pl_StdioFile f_pl{"stream data", f};
    stream.writeStreamJSON(version, jw, qpdf_sj_file, decode_level, &f_pl, filename);
    f_pl.finish();
    fclose(f);
}